

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdmanager.cc
# Opt level: O0

void __thiscall bdNodeManager::getDhtValue(bdNodeManager *this)

{
  string *in_RCX;
  string *in_RDX;
  bdNodeId *in_RSI;
  
  getDhtValue((bdNodeManager *)&this[-1].super_bdNode.mConnMgr,in_RSI,in_RDX,in_RCX);
  return;
}

Assistant:

int bdNodeManager::getDhtValue(const bdNodeId *id, std::string key, std::string & /*value*/) {
#ifdef DEBUG_MGR
	std::cerr << "bdNodeManager::getDhtValue() Id: ";
	mDhtFns->bdPrintNodeId(std::cerr, id);
	std::cerr << " key: " << key;
	std::cerr << " ... ? TODO" << std::endl;
#else
	(void) id;
	(void) key;
#endif

	return 1;
}